

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgdes(fitsfile *fptr,int colnum,LONGLONG rownum,long *length,long *heapaddr,int *status)

{
  int iVar1;
  long *in_RCX;
  int *in_RDX;
  undefined4 in_ESI;
  LONGLONG *in_RDI;
  long *in_R8;
  int *in_R9;
  LONGLONG heapaddrjj;
  LONGLONG lengthjj;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = ffgdesll((fitsfile *)lengthjj,heapaddrjj._4_4_,
                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                   (LONGLONG *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
  if (iVar1 < 1) {
    if (in_RCX != (long *)0x0) {
      if (local_40 <= 0x7fffffffffffffff) {
        *in_RCX = local_40;
      }
      else {
        *in_R9 = 0x19c;
      }
    }
    if (in_R8 != (long *)0x0) {
      if (local_48 <= 0x7fffffffffffffff) {
        *in_R8 = local_48;
      }
      else {
        *in_R9 = 0x19c;
      }
    }
    iVar1 = *in_R9;
  }
  else {
    iVar1 = *in_R9;
  }
  return iVar1;
}

Assistant:

int ffgdes(fitsfile *fptr, /* I - FITS file pointer                         */
           int colnum,     /* I - column number (1 = 1st column of table)   */
           LONGLONG rownum,    /* I - row number (1 = 1st row of table)         */
           long *length,   /* O - number of elements in the row             */
           long *heapaddr, /* O - heap pointer to the data                  */
           int *status)    /* IO - error status                             */
/*
  get (read) the variable length vector descriptor from the table.
*/
{
    LONGLONG lengthjj, heapaddrjj;
    
    if (ffgdesll(fptr, colnum, rownum, &lengthjj, &heapaddrjj, status) > 0)
        return(*status);

    /* convert the temporary 8-byte values to 4-byte values */
    /* check for overflow */
    if (length) {
        if (lengthjj > LONG_MAX)
	    *status = NUM_OVERFLOW;
	else
            *length = (long) lengthjj;
    }
    
    if (heapaddr) {
        if (heapaddrjj > LONG_MAX)
	    *status = NUM_OVERFLOW;
	else
            *heapaddr = (long) heapaddrjj;
    }
    return(*status);
}